

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O0

adios2_error
adios2_get(adios2_engine *engine,adios2_variable *variable,void *values,adios2_mode mode)

{
  DataType DVar1;
  Variable *pVVar2;
  DataType DVar3;
  Mode MVar4;
  DataType DVar5;
  ulong uVar6;
  undefined4 in_ECX;
  ulong in_RDX;
  long in_RSI;
  Variable *in_RDI;
  Mode modeCpp_13;
  Mode modeCpp_12;
  Mode modeCpp_11;
  Mode modeCpp_10;
  Mode modeCpp_9;
  Mode modeCpp_8;
  Mode modeCpp_7;
  Mode modeCpp_6;
  Mode modeCpp_5;
  Mode modeCpp_4;
  Mode modeCpp_3;
  Mode modeCpp_2;
  Mode modeCpp_1;
  Mode modeCpp;
  string dataStr;
  DataType type;
  VariableBase *variableBase;
  Engine *engineCpp;
  complex *local_610;
  complex *local_5e0;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  undefined8 in_stack_fffffffffffffa40;
  adios2_mode mode_00;
  allocator *paVar7;
  longdouble *local_5b0;
  double *local_580;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  adios2_variable *in_stack_fffffffffffffaa0;
  float *local_550;
  ulong *local_520;
  uint *local_4f0;
  ushort *local_4c0;
  uchar *local_490;
  long *local_460;
  int *local_430;
  short *local_400;
  signed *local_3d0;
  char *local_3a0;
  string *local_360;
  allocator local_2f1;
  string local_2f0 [32];
  Mode local_2d0;
  allocator local_2c9;
  string local_2c8 [32];
  Mode local_2a8;
  allocator local_2a1;
  string local_2a0 [32];
  Mode local_280;
  allocator local_279;
  string local_278 [32];
  Mode local_258;
  allocator local_251;
  string local_250 [32];
  Mode local_230;
  allocator local_229;
  string local_228 [32];
  Mode local_208;
  allocator local_201;
  string local_200 [32];
  Mode local_1e0;
  allocator local_1d9;
  string local_1d8 [32];
  Mode local_1b8;
  allocator local_1b1;
  string local_1b0 [32];
  Mode local_190;
  allocator local_189;
  string local_188 [32];
  Mode local_168;
  allocator local_161;
  string local_160 [32];
  Mode local_140;
  allocator local_139;
  string local_138 [32];
  Mode local_118;
  allocator local_111;
  string local_110 [32];
  Mode local_f0;
  allocator local_e9;
  string local_e8 [36];
  Mode local_c4;
  string local_c0 [36];
  DataType local_9c;
  long local_98;
  allocator local_89;
  string local_88 [32];
  Variable *local_68;
  allocator local_49;
  string local_48 [36];
  undefined4 local_24;
  ulong local_20;
  long local_18;
  Variable *local_10;
  
  mode_00 = (adios2_mode)((ulong)in_stack_fffffffffffffa40 >> 0x20);
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"for adios2_engine, in call to adios2_get",&local_49);
  adios2::helper::CheckForNullptr<adios2_engine>
            ((adios2_engine *)in_stack_fffffffffffffaa0,
             (string *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"for adios2_variable, in call to adios2_get",&local_89);
  adios2::helper::CheckForNullptr<adios2_variable>
            (in_stack_fffffffffffffaa0,
             (string *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_98 = local_18;
  DVar1 = *(DataType *)(local_18 + 0x28);
  if (DVar1 != Struct) {
    local_9c = DVar1;
    DVar3 = adios2::helper::GetDataType<std::__cxx11::string>();
    DVar5 = local_9c;
    if (DVar1 == DVar3) {
      std::__cxx11::string::string(local_c0);
      pVVar2 = local_68;
      if (local_98 == 0) {
        local_360 = (string *)0x0;
      }
      else {
        local_360 = (string *)
                    __dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo,
                                   &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
      }
      adios2::core::Engine::Get<std::__cxx11::string>(pVVar2,local_360,(Mode)local_c0);
      uVar6 = std::__cxx11::string::size();
      std::__cxx11::string::copy((char *)local_c0,local_20,uVar6);
      std::__cxx11::string::~string(local_c0);
    }
    else {
      DVar3 = adios2::helper::GetDataType<char>();
      DVar1 = local_9c;
      if (DVar5 == DVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_e8,
                   "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get",
                   &local_e9);
        MVar4 = anon_unknown.dwarf_205d4::adios2_ToMode
                          (mode_00,(string *)
                                   CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
        std::__cxx11::string::~string(local_e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        pVVar2 = local_68;
        local_c4 = MVar4;
        if (local_98 == 0) {
          local_3a0 = (char *)0x0;
        }
        else {
          local_3a0 = (char *)__dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo,
                                             &adios2::core::Variable<char>::typeinfo,0);
        }
        adios2::core::Engine::Get<char>(pVVar2,local_3a0,(Mode)local_20);
      }
      else {
        DVar3 = adios2::helper::GetDataType<signed_char>();
        DVar5 = local_9c;
        if (DVar1 == DVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_110,
                     "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get"
                     ,&local_111);
          MVar4 = anon_unknown.dwarf_205d4::adios2_ToMode
                            (mode_00,(string *)
                                     CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
          std::__cxx11::string::~string(local_110);
          std::allocator<char>::~allocator((allocator<char> *)&local_111);
          pVVar2 = local_68;
          local_f0 = MVar4;
          if (local_98 == 0) {
            local_3d0 = (signed *)0x0;
          }
          else {
            local_3d0 = (signed *)
                        __dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo,
                                       &adios2::core::Variable<signed_char>::typeinfo,0);
          }
          adios2::core::Engine::Get<signed_char>(pVVar2,local_3d0,(Mode)local_20);
        }
        else {
          DVar3 = adios2::helper::GetDataType<short>();
          DVar1 = local_9c;
          if (DVar5 == DVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_138,
                       "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get"
                       ,&local_139);
            MVar4 = anon_unknown.dwarf_205d4::adios2_ToMode
                              (mode_00,(string *)
                                       CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38)
                              );
            std::__cxx11::string::~string(local_138);
            std::allocator<char>::~allocator((allocator<char> *)&local_139);
            pVVar2 = local_68;
            local_118 = MVar4;
            if (local_98 == 0) {
              local_400 = (short *)0x0;
            }
            else {
              local_400 = (short *)__dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo,
                                                  &adios2::core::Variable<short>::typeinfo,0);
            }
            adios2::core::Engine::Get<short>(pVVar2,local_400,(Mode)local_20);
          }
          else {
            DVar3 = adios2::helper::GetDataType<int>();
            DVar5 = local_9c;
            if (DVar1 == DVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_160,
                         "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get"
                         ,&local_161);
              MVar4 = anon_unknown.dwarf_205d4::adios2_ToMode
                                (mode_00,(string *)
                                         CONCAT44(in_stack_fffffffffffffa3c,
                                                  in_stack_fffffffffffffa38));
              std::__cxx11::string::~string(local_160);
              std::allocator<char>::~allocator((allocator<char> *)&local_161);
              pVVar2 = local_68;
              local_140 = MVar4;
              if (local_98 == 0) {
                local_430 = (int *)0x0;
              }
              else {
                local_430 = (int *)__dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo,
                                                  &adios2::core::Variable<int>::typeinfo,0);
              }
              adios2::core::Engine::Get<int>(pVVar2,local_430,(Mode)local_20);
            }
            else {
              DVar3 = adios2::helper::GetDataType<long>();
              DVar1 = local_9c;
              if (DVar5 == DVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_188,
                           "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get"
                           ,&local_189);
                MVar4 = anon_unknown.dwarf_205d4::adios2_ToMode
                                  (mode_00,(string *)
                                           CONCAT44(in_stack_fffffffffffffa3c,
                                                    in_stack_fffffffffffffa38));
                std::__cxx11::string::~string(local_188);
                std::allocator<char>::~allocator((allocator<char> *)&local_189);
                pVVar2 = local_68;
                local_168 = MVar4;
                if (local_98 == 0) {
                  local_460 = (long *)0x0;
                }
                else {
                  local_460 = (long *)__dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo,
                                                     &adios2::core::Variable<long>::typeinfo,0);
                }
                adios2::core::Engine::Get<long>(pVVar2,local_460,(Mode)local_20);
              }
              else {
                DVar3 = adios2::helper::GetDataType<unsigned_char>();
                DVar5 = local_9c;
                if (DVar1 == DVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_1b0,
                             "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get"
                             ,&local_1b1);
                  MVar4 = anon_unknown.dwarf_205d4::adios2_ToMode
                                    (mode_00,(string *)
                                             CONCAT44(in_stack_fffffffffffffa3c,
                                                      in_stack_fffffffffffffa38));
                  std::__cxx11::string::~string(local_1b0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
                  pVVar2 = local_68;
                  local_190 = MVar4;
                  if (local_98 == 0) {
                    local_490 = (uchar *)0x0;
                  }
                  else {
                    local_490 = (uchar *)__dynamic_cast(local_98,&adios2::core::VariableBase::
                                                                  typeinfo,
                                                        &adios2::core::Variable<unsigned_char>::
                                                         typeinfo,0);
                  }
                  adios2::core::Engine::Get<unsigned_char>(pVVar2,local_490,(Mode)local_20);
                }
                else {
                  DVar3 = adios2::helper::GetDataType<unsigned_short>();
                  DVar1 = local_9c;
                  if (DVar5 == DVar3) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_1d8,
                               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get"
                               ,&local_1d9);
                    MVar4 = anon_unknown.dwarf_205d4::adios2_ToMode
                                      (mode_00,(string *)
                                               CONCAT44(in_stack_fffffffffffffa3c,
                                                        in_stack_fffffffffffffa38));
                    std::__cxx11::string::~string(local_1d8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
                    pVVar2 = local_68;
                    local_1b8 = MVar4;
                    if (local_98 == 0) {
                      local_4c0 = (ushort *)0x0;
                    }
                    else {
                      local_4c0 = (ushort *)
                                  __dynamic_cast(local_98,&adios2::core::VariableBase::typeinfo,
                                                 &adios2::core::Variable<unsigned_short>::typeinfo,0
                                                );
                    }
                    adios2::core::Engine::Get<unsigned_short>(pVVar2,local_4c0,(Mode)local_20);
                  }
                  else {
                    DVar3 = adios2::helper::GetDataType<unsigned_int>();
                    DVar5 = local_9c;
                    if (DVar1 == DVar3) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_200,
                                 "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get"
                                 ,&local_201);
                      MVar4 = anon_unknown.dwarf_205d4::adios2_ToMode
                                        (mode_00,(string *)
                                                 CONCAT44(in_stack_fffffffffffffa3c,
                                                          in_stack_fffffffffffffa38));
                      std::__cxx11::string::~string(local_200);
                      std::allocator<char>::~allocator((allocator<char> *)&local_201);
                      pVVar2 = local_68;
                      local_1e0 = MVar4;
                      if (local_98 == 0) {
                        local_4f0 = (uint *)0x0;
                      }
                      else {
                        local_4f0 = (uint *)__dynamic_cast(local_98,&adios2::core::VariableBase::
                                                                     typeinfo,
                                                           &adios2::core::Variable<unsigned_int>::
                                                            typeinfo,0);
                      }
                      adios2::core::Engine::Get<unsigned_int>(pVVar2,local_4f0,(Mode)local_20);
                    }
                    else {
                      DVar3 = adios2::helper::GetDataType<unsigned_long>();
                      DVar1 = local_9c;
                      if (DVar5 == DVar3) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  (local_228,
                                   "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get"
                                   ,&local_229);
                        MVar4 = anon_unknown.dwarf_205d4::adios2_ToMode
                                          (mode_00,(string *)
                                                   CONCAT44(in_stack_fffffffffffffa3c,
                                                            in_stack_fffffffffffffa38));
                        std::__cxx11::string::~string(local_228);
                        std::allocator<char>::~allocator((allocator<char> *)&local_229);
                        pVVar2 = local_68;
                        local_208 = MVar4;
                        if (local_98 == 0) {
                          local_520 = (ulong *)0x0;
                        }
                        else {
                          local_520 = (ulong *)__dynamic_cast(local_98,&adios2::core::VariableBase::
                                                                        typeinfo,
                                                              &adios2::core::Variable<unsigned_long>
                                                               ::typeinfo,0);
                        }
                        adios2::core::Engine::Get<unsigned_long>(pVVar2,local_520,(Mode)local_20);
                      }
                      else {
                        DVar3 = adios2::helper::GetDataType<float>();
                        DVar5 = local_9c;
                        if (DVar1 == DVar3) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    (local_250,
                                     "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get"
                                     ,&local_251);
                          MVar4 = anon_unknown.dwarf_205d4::adios2_ToMode
                                            (mode_00,(string *)
                                                     CONCAT44(in_stack_fffffffffffffa3c,
                                                              in_stack_fffffffffffffa38));
                          std::__cxx11::string::~string(local_250);
                          std::allocator<char>::~allocator((allocator<char> *)&local_251);
                          pVVar2 = local_68;
                          local_230 = MVar4;
                          if (local_98 == 0) {
                            local_550 = (float *)0x0;
                          }
                          else {
                            local_550 = (float *)__dynamic_cast(local_98,&adios2::core::VariableBase
                                                                          ::typeinfo,
                                                                &adios2::core::Variable<float>::
                                                                 typeinfo,0);
                          }
                          adios2::core::Engine::Get<float>(pVVar2,local_550,(Mode)local_20);
                        }
                        else {
                          DVar3 = adios2::helper::GetDataType<double>();
                          DVar1 = local_9c;
                          if (DVar5 == DVar3) {
                            paVar7 = &local_279;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      (local_278,
                                       "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get"
                                       ,paVar7);
                            MVar4 = anon_unknown.dwarf_205d4::adios2_ToMode
                                              (mode_00,(string *)
                                                       CONCAT44(in_stack_fffffffffffffa3c,
                                                                in_stack_fffffffffffffa38));
                            std::__cxx11::string::~string(local_278);
                            std::allocator<char>::~allocator((allocator<char> *)&local_279);
                            pVVar2 = local_68;
                            local_258 = MVar4;
                            if (local_98 == 0) {
                              local_580 = (double *)0x0;
                            }
                            else {
                              local_580 = (double *)
                                          __dynamic_cast(local_98,&adios2::core::VariableBase::
                                                                   typeinfo,
                                                         &adios2::core::Variable<double>::typeinfo,0
                                                        );
                            }
                            adios2::core::Engine::Get<double>(pVVar2,local_580,(Mode)local_20);
                          }
                          else {
                            DVar3 = adios2::helper::GetDataType<long_double>();
                            DVar5 = local_9c;
                            if (DVar1 == DVar3) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        (local_2a0,
                                         "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get"
                                         ,&local_2a1);
                              MVar4 = anon_unknown.dwarf_205d4::adios2_ToMode
                                                (mode_00,(string *)
                                                         CONCAT44(in_stack_fffffffffffffa3c,
                                                                  in_stack_fffffffffffffa38));
                              std::__cxx11::string::~string(local_2a0);
                              std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
                              pVVar2 = local_68;
                              local_280 = MVar4;
                              if (local_98 == 0) {
                                local_5b0 = (longdouble *)0x0;
                              }
                              else {
                                local_5b0 = (longdouble *)
                                            __dynamic_cast(local_98,&adios2::core::VariableBase::
                                                                     typeinfo,
                                                           &adios2::core::Variable<long_double>::
                                                            typeinfo,0);
                              }
                              adios2::core::Engine::Get<long_double>
                                        (pVVar2,local_5b0,(Mode)local_20);
                            }
                            else {
                              DVar3 = adios2::helper::GetDataType<std::complex<float>>();
                              DVar1 = local_9c;
                              if (DVar5 == DVar3) {
                                paVar7 = &local_2c9;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          (local_2c8,
                                           "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get"
                                           ,paVar7);
                                MVar4 = anon_unknown.dwarf_205d4::adios2_ToMode
                                                  ((adios2_mode)((ulong)paVar7 >> 0x20),
                                                   (string *)
                                                   CONCAT44(local_24,in_stack_fffffffffffffa38));
                                std::__cxx11::string::~string(local_2c8);
                                std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
                                pVVar2 = local_68;
                                local_2a8 = MVar4;
                                if (local_98 == 0) {
                                  local_5e0 = (complex *)0x0;
                                }
                                else {
                                  local_5e0 = (complex *)
                                              __dynamic_cast(local_98,&adios2::core::VariableBase::
                                                                       typeinfo,
                                                             &adios2::core::
                                                              Variable<std::complex<float>>::
                                                              typeinfo,0);
                                }
                                adios2::core::Engine::Get<std::complex<float>>
                                          (pVVar2,local_5e0,(Mode)local_20);
                              }
                              else {
                                DVar5 = adios2::helper::GetDataType<std::complex<double>>();
                                if (DVar1 == DVar5) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            (local_2f0,
                                             "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get"
                                             ,&local_2f1);
                                  MVar4 = anon_unknown.dwarf_205d4::adios2_ToMode
                                                    (mode_00,(string *)
                                                             CONCAT44(in_stack_fffffffffffffa3c,
                                                                      in_stack_fffffffffffffa38));
                                  std::__cxx11::string::~string(local_2f0);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
                                  pVVar2 = local_68;
                                  local_2d0 = MVar4;
                                  if (local_98 == 0) {
                                    local_610 = (complex *)0x0;
                                  }
                                  else {
                                    local_610 = (complex *)
                                                __dynamic_cast(local_98,&adios2::core::VariableBase
                                                                         ::typeinfo,
                                                               &adios2::core::
                                                                Variable<std::complex<double>>::
                                                                typeinfo,0);
                                  }
                                  adios2::core::Engine::Get<std::complex<double>>
                                            (pVVar2,local_610,(Mode)local_20);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_get(adios2_engine *engine, adios2_variable *variable, void *values,
                        const adios2_mode mode)
{
    try
    {
        adios2::helper::CheckForNullptr(engine, "for adios2_engine, in call to adios2_get");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call "
                                                  "to adios2_get");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);

        const adios2::DataType type(variableBase->m_Type);

        if (type == adios2::DataType::Struct)
        {
            // not supported
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            std::string dataStr;
            engineCpp->Get(*dynamic_cast<adios2::core::Variable<std::string> *>(variableBase),
                           dataStr);
            dataStr.copy(reinterpret_cast<char *>(values), dataStr.size());
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        const adios2::Mode modeCpp =                                                               \
            adios2_ToMode(mode, "only adios2_mode_deferred or adios2_mode_sync are valid, "        \
                                "in call to adios2_get");                                          \
        engineCpp->Get(*dynamic_cast<adios2::core::Variable<T> *>(variableBase),                   \
                       reinterpret_cast<T *>(values), modeCpp);                                    \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_get"));
    }
}